

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_JSONStringify(JSContext *ctx,JSValue obj,JSValue replacer,JSValue space0)

{
  JSShape *pJVar1;
  JSRuntime *pJVar2;
  JSValue key;
  JSValue indent;
  StringBuffer *pSVar3;
  int64_t iVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  JSRefCountHeader *p;
  JSToNumberHintEnum flag;
  uint end;
  ulong uVar8;
  ulong uVar9;
  JSValueUnion JVar10;
  ulong uVar11;
  JSValueUnion JVar12;
  int64_t iVar13;
  uint uVar14;
  JSValueUnion JVar15;
  ulong uVar16;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar17;
  JSValue JVar18;
  JSValue JVar19;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  ulong uStackY_110;
  int n_1;
  JSValueUnion local_f0;
  JSValueUnion local_e8;
  JSValueUnion local_e0 [2];
  JSONStringifyContext jsc_s;
  ulong local_78;
  int64_t n;
  StringBuffer b_s;
  
  iVar13 = replacer.tag;
  JVar10 = (JSValueUnion)obj.tag;
  JVar12 = obj.u;
  jsc_s.replacer_func.u.float64 = jsc_s.replacer_func.u.float64 & 0xffffffff00000000;
  jsc_s.replacer_func.tag = 3;
  jsc_s.stack.u.ptr = (void *)(jsc_s.stack._4_8_ << 0x20);
  jsc_s.stack.tag = 3;
  jsc_s.property_list.u.ptr = (void *)(jsc_s.property_list._4_8_ << 0x20);
  jsc_s.property_list.tag = 3;
  jsc_s.gap.u.ptr = (void *)(jsc_s.gap._4_8_ << 0x20);
  jsc_s.gap.tag = 3;
  jsc_s.b = &b_s;
  jsc_s.empty.u = *(JSValueUnion *)(ctx->rt->atom_array + 0x2f);
  *(int *)jsc_s.empty.u.ptr = *jsc_s.empty.u.ptr + 1;
  jsc_s.empty.tag = -7;
  b_s.len = 0;
  b_s.size = 0;
  b_s.is_wide_char = 0;
  b_s.error_status = 0;
  JVar15 = replacer.u;
  b_s.ctx = ctx;
  b_s.str = js_alloc_string(ctx,0,0);
  flag = JVar15.int32;
  if (b_s.str == (JSString *)0x0) {
    b_s.size = 0;
    b_s.error_status = -1;
  }
  pJVar1 = ctx->array_shape;
  (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
  jsc_s.stack = JS_NewObjectFromShape(ctx,pJVar1,2);
  if ((int)jsc_s.stack.tag == 6) {
LAB_0010d12f:
    JVar18 = (JSValue)(ZEXT816(3) << 0x40);
    uStackY_110 = 6;
  }
  else {
    iVar6 = JS_IsFunction(ctx,replacer);
    JVar15 = replacer.u;
    iVar4 = iVar13;
    if (iVar6 == 0) {
      iVar6 = JS_IsArray(ctx,replacer);
      if (-1 < iVar6) {
        JVar15 = jsc_s.replacer_func.u;
        iVar4 = jsc_s.replacer_func.tag;
        if (iVar6 == 0) goto LAB_0010d15f;
        pJVar1 = ctx->array_shape;
        (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
        local_f0 = JVar10;
        jsc_s.property_list = JS_NewObjectFromShape(ctx,pJVar1,2);
        if ((int)jsc_s.property_list.tag != 6) {
          iVar6 = js_get_length64(ctx,&n,replacer);
          flag = (JSToNumberHintEnum)iVar13;
          if (iVar6 == 0) {
            JVar10 = local_f0;
            JVar15 = jsc_s.replacer_func.u;
            iVar4 = jsc_s.replacer_func.tag;
            if (0 < n) {
              uVar16 = 0;
              local_78 = 0;
              do {
                uVar9 = uVar16;
                local_e0 = (JSValueUnion  [2])JS_GetPropertyInt64(ctx,replacer,uVar16);
                uVar11 = local_e0[1];
                iVar6 = local_e0[1]._0_4_;
                if (iVar6 == 6) {
LAB_0010d348:
                  cVar5 = '\x02';
                }
                else if (iVar6 == -1) {
                  if ((*(ushort *)((long)local_e0[0].ptr + 6) & 0xfffe) == 4) {
                    local_e0 = (JSValueUnion  [2])JS_ToStringFree(ctx,(JSValue)local_e0);
                    uVar11 = local_e0[1];
                    uVar8 = uVar11 & 0xffffffff;
                    uVar9 = CONCAT71((int7)(uVar8 >> 8),uVar8 != 6);
                    cVar5 = (uVar8 == 6) * '\x02';
                  }
                  else {
                    JS_FreeValue(ctx,(JSValue)local_e0);
                    uVar9 = 0;
                    cVar5 = '\x05';
                  }
                  if ((char)uVar9 != '\0') goto LAB_0010d319;
                }
                else {
                  if ((iVar6 == 7) || (iVar6 == 0)) {
                    local_e0 = (JSValueUnion  [2])JS_ToStringFree(ctx,(JSValue)local_e0);
                    uVar11 = local_e0[1];
                    if (local_e0[1]._0_4_ == 6) goto LAB_0010d348;
                  }
                  else {
                    uVar9 = uVar11 & 0xffffffff;
                    if (iVar6 != -7) {
                      JS_FreeValue(ctx,(JSValue)local_e0);
                      cVar5 = '\x05';
                      goto LAB_0010d34b;
                    }
                  }
LAB_0010d319:
                  uVar9 = 1;
                  JVar18 = js_array_includes(ctx,jsc_s.property_list,1,(JSValue *)local_e0);
                  if ((int)JVar18.tag == 6) {
                    JVar18.tag = uVar11;
                    JVar18.u.float64 = local_e0[0].float64;
                    JS_FreeValue(ctx,JVar18);
                    goto LAB_0010d348;
                  }
                  iVar6 = JS_ToBoolFree(ctx,JVar18);
                  if (iVar6 == 0) {
                    uVar9 = local_78 + 1;
                    JVar19.tag = uVar11;
                    JVar19.u.ptr = local_e0[0].ptr;
                    JS_SetPropertyInt64(ctx,jsc_s.property_list,local_78,JVar19);
                    cVar5 = '\0';
                    local_78 = uVar9;
                  }
                  else {
                    v.tag = uVar11;
                    v.u.ptr = local_e0[0].ptr;
                    JS_FreeValue(ctx,v);
                    cVar5 = '\0';
                  }
                }
LAB_0010d34b:
                flag = (JSToNumberHintEnum)uVar9;
                if ((cVar5 != '\0') && (cVar5 != '\x05')) {
                  if (cVar5 == '\x02') goto LAB_0010d12f;
                  uStackY_110 = 3;
                  JVar15.float64 = 0.0;
                  goto LAB_0010d64c;
                }
                uVar16 = uVar16 + 1;
                JVar10 = local_f0;
                JVar15 = jsc_s.replacer_func.u;
                iVar4 = jsc_s.replacer_func.tag;
              } while (n != uVar16);
            }
            goto LAB_0010d15f;
          }
        }
      }
      goto LAB_0010d12f;
    }
LAB_0010d15f:
    jsc_s.replacer_func.tag = iVar4;
    jsc_s.replacer_func.u = JVar15;
    local_f0 = JVar10;
    JVar15 = local_f0;
    _n_1 = space0.u;
    if (0xfffffff4 < (uint)space0.tag) {
      *(int *)space0.u.ptr = *space0.u.ptr + 1;
    }
    local_e8 = space0.u;
    uStackY_110 = 6;
    if ((uint)space0.tag == 0xffffffff) {
      if (*(short *)((long)space0.u.ptr + 6) == 5) {
        space0 = JS_ToStringFree(ctx,space0);
        JVar15 = local_f0;
      }
      else if (*(short *)((long)space0.u.ptr + 6) == 4) {
        space0 = JS_ToNumberHintFree(ctx,space0,flag);
      }
      local_e8 = space0.u;
      if ((int)space0.tag != 6) goto LAB_0010d419;
LAB_0010d51d:
      JVar18 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
LAB_0010d419:
      local_e8 = space0.u;
      uVar14 = (uint)space0.tag;
      if ((uVar14 == 7) || (uVar14 == 0)) {
        local_f0.float64 = local_e8.float64;
        iVar6 = JS_ToInt32Clamp(ctx,&n_1,space0,0,10,0);
        if (iVar6 != 0) goto LAB_0010d51d;
        jsc_s.gap = JS_NewStringLen(ctx,"          ",(long)n_1);
        _n_1 = local_f0;
      }
      else if (uVar14 == 0xfffffff9) {
        uVar7 = *(uint *)((long)local_e8.ptr + 4) & 0x7fffffff;
        end = 10;
        if (uVar7 < 10) {
          end = uVar7;
        }
        local_f0.float64 = local_e8.float64;
        jsc_s.gap = js_sub_string(ctx,(JSString *)local_e8.ptr,0,end);
        _n_1 = local_f0;
      }
      else {
        if (0xfffffff4 < (uint)jsc_s.empty.tag) {
          *(int *)jsc_s.empty.u.ptr = *jsc_s.empty.u.ptr + 1;
        }
        jsc_s.gap.tag = jsc_s.empty.tag;
        jsc_s.gap.u.float64 = jsc_s.empty.u.float64;
        _n_1 = local_e8;
      }
      if ((0xfffffff4 < uVar14) && (iVar6 = *_n_1, *(int *)_n_1 = iVar6 + -1, iVar6 < 2)) {
        v_00.tag = space0.tag;
        v_00.u.ptr = _n_1;
        __JS_FreeValueRT(ctx->rt,v_00);
      }
      if ((int)jsc_s.gap.tag == 6) goto LAB_0010d51d;
      JVar18 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
      if ((int)JVar18.tag != 6) {
        if (0xfffffff4 < JVar15._0_4_) {
          *(int *)JVar12.ptr = *JVar12.ptr + 1;
        }
        val.tag = (int64_t)JVar15.ptr;
        val.u.ptr = JVar12.ptr;
        _n_1 = JVar12;
        iVar6 = JS_DefinePropertyValue(ctx,JVar18,0x2f,val,7);
        if (-1 < iVar6) {
          if (0xfffffff4 < JVar15._0_4_) {
            *(int *)JVar12.ptr = *JVar12.ptr + 1;
          }
          key.tag = jsc_s.empty.tag;
          key.u.float64 = jsc_s.empty.u.float64;
          val_00.tag = (int64_t)JVar15.ptr;
          val_00.u.ptr = JVar12.ptr;
          _n_1 = JVar12;
          JVar19 = js_json_check(ctx,&jsc_s,JVar18,val_00,key);
          if ((int)JVar19.tag == 3) {
            uStackY_110 = 3;
          }
          else if ((int)JVar19.tag == 6) {
            uStackY_110 = JVar19.tag & 0xffffffff;
          }
          else {
            indent.tag = jsc_s.empty.tag;
            indent.u.float64 = jsc_s.empty.u.float64;
            val_01.tag = (int64_t)JVar15.ptr;
            val_01.u.ptr = JVar12.ptr;
            iVar6 = js_json_to_str(ctx,&jsc_s,JVar19,val_01,indent);
            if (iVar6 == 0) {
              JVar19 = string_buffer_end(jsc_s.b);
              uStackY_110 = JVar19.tag;
              uVar16 = (ulong)JVar19.u.ptr & 0xffffffff00000000;
              uVar9 = (ulong)JVar19.u._0_4_;
              goto LAB_0010d545;
            }
          }
        }
      }
    }
  }
  pSVar3 = jsc_s.b;
  pJVar2 = (jsc_s.b)->ctx->rt;
  (*(pJVar2->mf).js_free)(&pJVar2->malloc_state,(jsc_s.b)->str);
  pSVar3->str = (JSString *)0x0;
  uVar9 = 0;
  uVar16 = 0;
LAB_0010d545:
  _n_1 = JVar18.u;
  if ((0xfffffff4 < (uint)JVar18.tag) && (iVar6 = *_n_1, *(int *)_n_1 = iVar6 + -1, iVar6 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar18);
  }
  _n_1 = jsc_s.empty.u;
  if ((0xfffffff4 < (uint)jsc_s.empty.tag) &&
     (iVar6 = *jsc_s.empty.u.ptr, *(int *)jsc_s.empty.u.ptr = iVar6 + -1, iVar6 < 2)) {
    v_01.tag = jsc_s.empty.tag;
    v_01.u.float64 = jsc_s.empty.u.float64;
    __JS_FreeValueRT(ctx->rt,v_01);
  }
  _n_1 = jsc_s.gap.u;
  if ((0xfffffff4 < (uint)jsc_s.gap.tag) &&
     (iVar6 = *jsc_s.gap.u.ptr, *(int *)jsc_s.gap.u.ptr = iVar6 + -1, iVar6 < 2)) {
    __JS_FreeValueRT(ctx->rt,jsc_s.gap);
  }
  _n_1 = jsc_s.property_list.u;
  if ((0xfffffff4 < (uint)jsc_s.property_list.tag) &&
     (iVar6 = *jsc_s.property_list.u.ptr, *(int *)jsc_s.property_list.u.ptr = iVar6 + -1, iVar6 < 2)
     ) {
    __JS_FreeValueRT(ctx->rt,jsc_s.property_list);
  }
  _n_1 = jsc_s.stack.u;
  if ((0xfffffff4 < (uint)jsc_s.stack.tag) &&
     (iVar6 = *jsc_s.stack.u.ptr, *(int *)jsc_s.stack.u.ptr = iVar6 + -1, iVar6 < 2)) {
    __JS_FreeValueRT(ctx->rt,jsc_s.stack);
  }
  JVar15.ptr = (void *)(uVar16 | uVar9);
LAB_0010d64c:
  JVar17.tag = uStackY_110;
  JVar17.u.ptr = JVar15.ptr;
  return JVar17;
}

Assistant:

JSValue JS_JSONStringify(JSContext *ctx, JSValueConst obj,
                         JSValueConst replacer, JSValueConst space0)
{
    StringBuffer b_s;
    JSONStringifyContext jsc_s, *jsc = &jsc_s;
    JSValue val, v, space, ret, wrapper;
    int res;
    int64_t i, j, n;

    jsc->replacer_func = JS_UNDEFINED;
    jsc->stack = JS_UNDEFINED;
    jsc->property_list = JS_UNDEFINED;
    jsc->gap = JS_UNDEFINED;
    jsc->b = &b_s;
    jsc->empty = JS_AtomToString(ctx, JS_ATOM_empty_string);
    ret = JS_UNDEFINED;
    wrapper = JS_UNDEFINED;

    string_buffer_init(ctx, jsc->b, 0);
    jsc->stack = JS_NewArray(ctx);
    if (JS_IsException(jsc->stack))
        goto exception;
    if (JS_IsFunction(ctx, replacer)) {
        jsc->replacer_func = replacer;
    } else {
        res = JS_IsArray(ctx, replacer);
        if (res < 0)
            goto exception;
        if (res) {
            /* XXX: enumeration is not fully correct */
            jsc->property_list = JS_NewArray(ctx);
            if (JS_IsException(jsc->property_list))
                goto exception;
            if (js_get_length64(ctx, &n, replacer))
                goto exception;
            for (i = j = 0; i < n; i++) {
                JSValue present;
                v = JS_GetPropertyInt64(ctx, replacer, i);
                if (JS_IsException(v))
                    goto exception;
                if (JS_IsObject(v)) {
                    JSObject *p = JS_VALUE_GET_OBJ(v);
                    if (p->class_id == JS_CLASS_STRING ||
                        p->class_id == JS_CLASS_NUMBER) {
                        v = JS_ToStringFree(ctx, v);
                        if (JS_IsException(v))
                            goto exception;
                    } else {
                        JS_FreeValue(ctx, v);
                        continue;
                    }
                } else if (JS_IsNumber(v)) {
                    v = JS_ToStringFree(ctx, v);
                    if (JS_IsException(v))
                        goto exception;
                } else if (!JS_IsString(v)) {
                    JS_FreeValue(ctx, v);
                    continue;
                }
                present = js_array_includes(ctx, jsc->property_list,
                                            1, (JSValueConst *)&v);
                if (JS_IsException(present)) {
                    JS_FreeValue(ctx, v);
                    goto exception;
                }
                if (!JS_ToBoolFree(ctx, present)) {
                    JS_SetPropertyInt64(ctx, jsc->property_list, j++, v);
                } else {
                    JS_FreeValue(ctx, v);
                }
            }
        }
    }
    space = JS_DupValue(ctx, space0);
    if (JS_IsObject(space)) {
        JSObject *p = JS_VALUE_GET_OBJ(space);
        if (p->class_id == JS_CLASS_NUMBER) {
            space = JS_ToNumberFree(ctx, space);
        } else if (p->class_id == JS_CLASS_STRING) {
            space = JS_ToStringFree(ctx, space);
        }
        if (JS_IsException(space)) {
            JS_FreeValue(ctx, space);
            goto exception;
        }
    }
    if (JS_IsNumber(space)) {
        int n;
        if (JS_ToInt32Clamp(ctx, &n, space, 0, 10, 0))
            goto exception;
        jsc->gap = JS_NewStringLen(ctx, "          ", n);
    } else if (JS_IsString(space)) {
        JSString *p = JS_VALUE_GET_STRING(space);
        jsc->gap = js_sub_string(ctx, p, 0, min_int(p->len, 10));
    } else {
        jsc->gap = JS_DupValue(ctx, jsc->empty);
    }
    JS_FreeValue(ctx, space);
    if (JS_IsException(jsc->gap))
        goto exception;
    wrapper = JS_NewObject(ctx);
    if (JS_IsException(wrapper))
        goto exception;
    if (JS_DefinePropertyValue(ctx, wrapper, JS_ATOM_empty_string,
                               JS_DupValue(ctx, obj), JS_PROP_C_W_E) < 0)
        goto exception;
    val = JS_DupValue(ctx, obj);
                           
    val = js_json_check(ctx, jsc, wrapper, val, jsc->empty);
    if (JS_IsException(val))
        goto exception;
    if (JS_IsUndefined(val)) {
        ret = JS_UNDEFINED;
        goto done1;
    }
    if (js_json_to_str(ctx, jsc, wrapper, val, jsc->empty))
        goto exception;

    ret = string_buffer_end(jsc->b);
    goto done;

exception:
    ret = JS_EXCEPTION;
done1:
    string_buffer_free(jsc->b);
done:
    JS_FreeValue(ctx, wrapper);
    JS_FreeValue(ctx, jsc->empty);
    JS_FreeValue(ctx, jsc->gap);
    JS_FreeValue(ctx, jsc->property_list);
    JS_FreeValue(ctx, jsc->stack);
    return ret;
}